

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_iterate64(roaring_bitmap_t *r,roaring_iterator64 iterator,uint64_t high_bits,void *ptr
                       )

{
  _Bool _Var1;
  int local_3c;
  int i;
  roaring_array_t *ra;
  void *ptr_local;
  uint64_t high_bits_local;
  roaring_iterator64 iterator_local;
  roaring_bitmap_t *r_local;
  
  local_3c = 0;
  while( true ) {
    if ((r->high_low_container).size <= local_3c) {
      return true;
    }
    _Var1 = container_iterate64((r->high_low_container).containers[local_3c],
                                (r->high_low_container).typecodes[local_3c],
                                (uint)(r->high_low_container).keys[local_3c] << 0x10,iterator,
                                high_bits,ptr);
    if (!_Var1) break;
    local_3c = local_3c + 1;
  }
  return false;
}

Assistant:

bool roaring_iterate64(const roaring_bitmap_t *r, roaring_iterator64 iterator,
                       uint64_t high_bits, void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate64(
                ra->containers[i], ra->typecodes[i],
                ((uint32_t)ra->keys[i]) << 16, iterator,
                high_bits, ptr)) {
            return false;
        }
    return true;
}